

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O0

SshChannel * ssh2_serverside_agent_open(ConnectionLayer *cl,Channel *chan)

{
  LogContext *ctx;
  ssh2_channel *c_00;
  char *event;
  PktOut *pPVar1;
  PktOut *pktout;
  ssh2_channel *c;
  PacketProtocolLayer *ppl;
  ssh2_connection_state *s;
  Channel *chan_local;
  ConnectionLayer *cl_local;
  
  c_00 = (ssh2_channel *)safemalloc(1,0xc0,0);
  c_00->connlayer = (ssh2_connection_state *)&cl[-0xe].vt;
  ssh2_channel_init(c_00);
  c_00->halfopen = true;
  c_00->chan = chan;
  ctx = cl[5].logctx;
  event = dupprintf("Forwarding SSH agent to client");
  logevent_and_free(ctx,event);
  pPVar1 = ssh2_chanopen_init(c_00,"auth-agent@openssh.com");
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar1->qnode);
  return &c_00->sc;
}

Assistant:

SshChannel *ssh2_serverside_agent_open(ConnectionLayer *cl, Channel *chan)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh2_channel *c = snew(struct ssh2_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh2_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    ppl_logevent("Forwarding SSH agent to client");

    pktout = ssh2_chanopen_init(c, "auth-agent@openssh.com");
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}